

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

void nni_dialer_add_stat(nni_dialer *d,nni_stat_item *item)

{
  nni_stat_item *item_local;
  nni_dialer *d_local;
  
  nni_stat_add(&d->st_root,item);
  return;
}

Assistant:

void
nni_dialer_add_stat(nni_dialer *d, nni_stat_item *item)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_add(&d->st_root, item);
#else
	NNI_ARG_UNUSED(d);
	NNI_ARG_UNUSED(item);
#endif
}